

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

bool __thiscall cmNinjaTargetGenerator::NeedDepTypeMSVC(cmNinjaTargetGenerator *this,string *lang)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  bool local_f9;
  allocator local_d1;
  string local_d0;
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *mf;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  mf = (cmMakefile *)lang;
  lang_local = (string *)this;
  bVar2 = std::operator==(lang,"C");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              mf,"CXX"), bVar2)) {
    pcVar4 = GetMakefile(this);
    local_28 = pcVar4;
    std::allocator<char>::allocator();
    local_82 = 0;
    local_83 = 0;
    local_aa = 0;
    local_ab = 0;
    bVar1 = false;
    bVar2 = false;
    std::__cxx11::string::string((string *)&local_48,"CMAKE_C_COMPILER_ID",&local_49);
    pcVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_48);
    iVar3 = strcmp(pcVar5,"MSVC");
    pcVar4 = local_28;
    local_f9 = true;
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      local_82 = 1;
      std::__cxx11::string::string((string *)&local_80,"CMAKE_CXX_COMPILER_ID",&local_81);
      local_83 = 1;
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_80);
      iVar3 = strcmp(pcVar5,"MSVC");
      pcVar4 = local_28;
      local_f9 = true;
      if (iVar3 != 0) {
        std::allocator<char>::allocator();
        local_aa = 1;
        std::__cxx11::string::string((string *)&local_a8,"CMAKE_C_SIMULATE_ID",&local_a9);
        local_ab = 1;
        pcVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_a8);
        iVar3 = strcmp(pcVar5,"MSVC");
        pcVar4 = local_28;
        local_f9 = true;
        if (iVar3 != 0) {
          std::allocator<char>::allocator();
          bVar1 = true;
          std::__cxx11::string::string((string *)&local_d0,"CMAKE_CXX_SIMULATE_ID",&local_d1);
          bVar2 = true;
          pcVar5 = cmMakefile::GetSafeDefinition(pcVar4,&local_d0);
          iVar3 = strcmp(pcVar5,"MSVC");
          local_f9 = iVar3 == 0;
        }
      }
    }
    this_local._7_1_ = local_f9;
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_d0);
    }
    if (bVar1) {
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    if ((local_ab & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_a8);
    }
    if ((local_aa & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    if ((local_83 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_80);
    }
    if ((local_82 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmNinjaTargetGenerator::NeedDepTypeMSVC(const std::string& lang) const
{
  if (lang == "C" || lang == "CXX")
    {
    cmMakefile* mf = this->GetMakefile();
    return (
      strcmp(mf->GetSafeDefinition("CMAKE_C_COMPILER_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_C_SIMULATE_ID"), "MSVC") == 0 ||
      strcmp(mf->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID"), "MSVC") == 0
      );
    }
  return false;
}